

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Mocap.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_Mocap::ChFunction_Mocap(ChFunction_Mocap *this,ChFunction_Mocap *other)

{
  double dVar1;
  
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_Mocap_01190d48;
  (this->array_y).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->array_y).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->array_y_dtdt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->array_y_dtdt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  Set_samples(this,other->samples);
  dVar1 = other->samp_freq;
  this->samp_freq = dVar1;
  this->timetot = (double)this->samples / dVar1;
  Eigen::internal::
  call_assignment<Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,1,0,_1,1>>
            (&this->array_y,&other->array_y);
  Eigen::internal::
  call_assignment<Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,1,0,_1,1>>
            (&this->array_y_dt,&other->array_y_dt);
  Eigen::internal::
  call_assignment<Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,1,0,_1,1>>
            (&this->array_y_dtdt,&other->array_y_dtdt);
  return;
}

Assistant:

ChFunction_Mocap::ChFunction_Mocap(const ChFunction_Mocap& other) {
    Set_samples(other.samples);  // this creates arrays
    Set_samp_freq(other.samp_freq);

    array_y = other.array_y;
    array_y_dt = other.array_y_dt;
    array_y_dtdt = other.array_y_dtdt;
}